

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
helics::apps::Connector::scanPotentialInterfaceTemplates
          (Connector *this,ConnectionsList *possibleConnections)

{
  string_view testString;
  string_view testString_00;
  string_view testString_01;
  string_view interfaceName;
  string_view interfaceName_00;
  string_view interfaceName_01;
  ulong uVar1;
  bool bVar2;
  undefined1 uVar3;
  size_t sVar4;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *ptVar5;
  size_t sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  check_2;
  string possibility_2;
  size_t ii_2;
  TemplateMatcher *endTemplate;
  iterator __end2_2;
  iterator __begin2_2;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *__range2_2;
  optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  check_1;
  string possibility_1;
  size_t ii_1;
  TemplateMatcher *pubTemplate;
  iterator __end2_1;
  iterator __begin2_1;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *__range2_1;
  optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  check;
  string possibility;
  size_t ii;
  TemplateMatcher *inpTemplate;
  iterator __end2;
  iterator __begin2;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  reference in_stack_fffffffffffffd40;
  TemplateMatcher *in_stack_fffffffffffffd48;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_210;
  TemplateMatcher *local_1e0;
  __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
  local_1d8;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *in_stack_fffffffffffffe30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *potentials;
  TemplateMatcher *in_stack_fffffffffffffe38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe40;
  Connector *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  __sv_type in_stack_fffffffffffffe68;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_fffffffffffffe78;
  ulong local_120;
  __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  size_t local_f8;
  char *pcStack_f0;
  size_t local_e8;
  char *pcStack_e0;
  size_t local_d8;
  char *pcStack_d0;
  __sv_type local_c0;
  __sv_type local_68;
  ulong local_38;
  reference local_30;
  iterator local_28;
  iterator local_20;
  pointer local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_18 = (pointer)((long)&in_RSI[0x18].field_2 + 8);
  local_10 = in_RSI;
  local_20 = CLI::std::
             vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::
             begin((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                    *)in_stack_fffffffffffffcd8);
  local_28 = CLI::std::
             vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::
             end((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                  *)in_stack_fffffffffffffcd8);
  while (bVar2 = __gnu_cxx::
                 operator==<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                           ((__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                             *)in_stack_fffffffffffffce0,
                            (__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                             *)in_stack_fffffffffffffcd8), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_30 = __gnu_cxx::
               __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
               ::operator*(&stack0xffffffffffffffe0);
    for (local_38 = 0; uVar1 = local_38,
        sVar4 = TemplateMatcher::possibilitiesCount((TemplateMatcher *)0x1f3925), uVar1 < sVar4;
        local_38 = local_38 + 1) {
      in_stack_fffffffffffffd48 = (TemplateMatcher *)&stack0xffffffffffffffa8;
      TemplateMatcher::instantiateTemplate_abi_cxx11_
                (in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40);
      local_68 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffce0)
      ;
      in_stack_fffffffffffffcd8 = local_10 + 0x18;
      interfaceName._M_str = in_stack_fffffffffffffe58;
      interfaceName._M_len = (size_t)in_stack_fffffffffffffe50;
      in_stack_fffffffffffffce0 = local_10;
      bVar2 = checkPotentialConnection
                        (in_stack_fffffffffffffe48,interfaceName,in_stack_fffffffffffffe40,
                         (unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         (vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                          *)in_stack_fffffffffffffe68._M_str,in_stack_fffffffffffffe78);
      if (bVar2) {
        in_stack_fffffffffffffd40 = local_30;
        local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                             (in_stack_fffffffffffffce0);
        testString._M_str = (char *)in_stack_fffffffffffffe48;
        testString._M_len = (size_t)in_stack_fffffffffffffe40;
        TemplateMatcher::isTemplateMatch(in_stack_fffffffffffffe38,testString);
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)0x1f3a3a);
        if (bVar2) {
          ptVar5 = CLI::std::
                   optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator*((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)0x1f3a5a);
          local_f8 = (ptVar5->
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     ).
                     super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     .
                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                     ._M_head_impl._M_len;
          pcStack_f0 = (ptVar5->
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       ).
                       super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                       ._M_head_impl._M_str;
          local_e8 = (ptVar5->
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     ).
                     super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     .
                     super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                     ._M_head_impl._M_len;
          pcStack_e0 = (ptVar5->
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       ).
                       super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                       ._M_head_impl._M_str;
          local_d8 = (ptVar5->
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     ).
                     super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                     ._M_head_impl._M_len;
          pcStack_d0 = (ptVar5->
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       ).
                       super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                       ._M_head_impl._M_str;
          TemplateMatcher::setAsUsed
                    ((TemplateMatcher *)
                     CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                     in_stack_fffffffffffffcf8);
        }
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce0);
    }
    __gnu_cxx::
    __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
    ::operator++(&stack0xffffffffffffffe0);
  }
  local_100 = local_10 + 0x18;
  local_108._M_current =
       (TemplateMatcher *)
       CLI::std::
       vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::begin
                 ((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                   *)in_stack_fffffffffffffcd8);
  CLI::std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::
  end((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *)
      in_stack_fffffffffffffcd8);
  while (bVar2 = __gnu_cxx::
                 operator==<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                           ((__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                             *)in_stack_fffffffffffffce0,
                            (__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                             *)in_stack_fffffffffffffcd8), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
    ::operator*(&local_108);
    for (local_120 = 0; sVar4 = TemplateMatcher::possibilitiesCount((TemplateMatcher *)0x1f3b90),
        local_120 < sVar4; local_120 = local_120 + 1) {
      TemplateMatcher::instantiateTemplate_abi_cxx11_
                (in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffce0);
      in_stack_fffffffffffffcd8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&local_10[0x18].field_2 + 8);
      interfaceName_00._M_str = in_stack_fffffffffffffe58;
      interfaceName_00._M_len = (size_t)in_stack_fffffffffffffe50;
      in_stack_fffffffffffffce0 = local_10;
      bVar2 = checkPotentialConnection
                        (in_stack_fffffffffffffe48,interfaceName_00,in_stack_fffffffffffffe40,
                         (unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         (vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                          *)in_stack_fffffffffffffe68._M_str,in_stack_fffffffffffffe78);
      if (bVar2) {
        in_stack_fffffffffffffe68 =
             std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffce0);
        testString_00._M_str = (char *)in_stack_fffffffffffffe48;
        testString_00._M_len = (size_t)in_stack_fffffffffffffe40;
        TemplateMatcher::isTemplateMatch(in_stack_fffffffffffffe38,testString_00);
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)0x1f3ca2);
        if (bVar2) {
          ptVar5 = CLI::std::
                   optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator*((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)0x1f3cc2);
          in_stack_fffffffffffffe38 =
               (TemplateMatcher *)
               (ptVar5->
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               ).
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
               super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_len;
          in_stack_fffffffffffffe40 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (ptVar5->
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               ).
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
               super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
          in_stack_fffffffffffffe48 =
               (Connector *)
               (ptVar5->
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               ).
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_len;
          in_stack_fffffffffffffe50 =
               (ptVar5->
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               ).
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
          in_stack_fffffffffffffe58 =
               (char *)(ptVar5->
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       ).
                       super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                       ._M_head_impl._M_len;
          TemplateMatcher::setAsUsed
                    ((TemplateMatcher *)
                     CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                     in_stack_fffffffffffffcf8);
        }
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce0);
    }
    __gnu_cxx::
    __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
    ::operator++(&local_108);
  }
  potentials = &local_10[0x19].field_2;
  local_1d8._M_current =
       (TemplateMatcher *)
       CLI::std::
       vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::begin
                 ((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                   *)in_stack_fffffffffffffcd8);
  local_1e0 = (TemplateMatcher *)
              CLI::std::
              vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              ::end((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                     *)in_stack_fffffffffffffcd8);
  while (bVar2 = __gnu_cxx::
                 operator==<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                           ((__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                             *)in_stack_fffffffffffffce0,
                            (__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                             *)in_stack_fffffffffffffcd8), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_210.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_str =
         (char *)__gnu_cxx::
                 __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                 ::operator*(&local_1d8);
    for (local_210.
         super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
         .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
         _M_head_impl._M_len = 0;
        sVar4 = local_210.
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                ._M_head_impl._M_len,
        sVar6 = TemplateMatcher::possibilitiesCount((TemplateMatcher *)0x1f3df8), sVar4 < sVar6;
        local_210.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len =
             local_210.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
             .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_len + 1) {
      ptVar5 = &local_210;
      TemplateMatcher::instantiateTemplate_abi_cxx11_
                (in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffce0);
      in_stack_fffffffffffffcd8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &local_10[0x19].field_2;
      interfaceName_01._M_str = in_stack_fffffffffffffe58;
      interfaceName_01._M_len = (size_t)in_stack_fffffffffffffe50;
      in_stack_fffffffffffffce0 = local_10;
      uVar3 = checkPotentialConnection
                        (in_stack_fffffffffffffe48,interfaceName_01,in_stack_fffffffffffffe40,
                         (unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)in_stack_fffffffffffffe38,
                         (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                          *)potentials,
                         (vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                          *)in_stack_fffffffffffffe68._M_str,in_stack_fffffffffffffe78);
      if ((bool)uVar3) {
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffce0);
        testString_01._M_str = (char *)in_stack_fffffffffffffe48;
        testString_01._M_len = (size_t)in_stack_fffffffffffffe40;
        TemplateMatcher::isTemplateMatch(in_stack_fffffffffffffe38,testString_01);
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)0x1f3f0a);
        if (bVar2) {
          CLI::std::
          optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator*((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)0x1f3f2a);
          TemplateMatcher::setAsUsed
                    ((TemplateMatcher *)CONCAT17(uVar3,in_stack_fffffffffffffd00),ptVar5);
        }
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce0);
    }
    __gnu_cxx::
    __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
    ::operator++(&local_1d8);
  }
  return;
}

Assistant:

void Connector::scanPotentialInterfaceTemplates(ConnectionsList& possibleConnections)
{
    /** now run through the potential interface templates as if they were directly listed*/
    for (auto& inpTemplate : possibleConnections.potentialInputTemplates) {
        for (std::size_t ii = 0; ii < inpTemplate.possibilitiesCount(); ++ii) {
            const std::string possibility = inpTemplate.instantiateTemplate(ii);
            if (checkPotentialConnection(possibility,
                                         possibleConnections.tagCodes,
                                         possibleConnections.pubs,
                                         possibleConnections.potentialPubs,
                                         possibleConnections.potentialPublicationTemplates,
                                         possibleConnections.aliases)) {
                auto check = inpTemplate.isTemplateMatch(possibility);
                if (check) {
                    inpTemplate.setAsUsed(*check);
                }
            }
        }
    }
    for (auto& pubTemplate : possibleConnections.potentialPublicationTemplates) {
        for (std::size_t ii = 0; ii < pubTemplate.possibilitiesCount(); ++ii) {
            const std::string possibility = pubTemplate.instantiateTemplate(ii);
            if (checkPotentialConnection(possibility,
                                         possibleConnections.tagCodes,
                                         possibleConnections.inputs,
                                         possibleConnections.potentialInputs,
                                         possibleConnections.potentialInputTemplates,
                                         possibleConnections.aliases)) {
                auto check = pubTemplate.isTemplateMatch(possibility);
                if (check) {
                    pubTemplate.setAsUsed(*check);
                }
            }
        }
    }
    for (auto& endTemplate : possibleConnections.potentialEndpointTemplates) {
        for (std::size_t ii = 0; ii < endTemplate.possibilitiesCount(); ++ii) {
            const std::string possibility = endTemplate.instantiateTemplate(ii);
            if (checkPotentialConnection(possibility,
                                         possibleConnections.tagCodes,
                                         possibleConnections.endpoints,
                                         possibleConnections.potentialEndpoints,
                                         possibleConnections.potentialEndpointTemplates,
                                         possibleConnections.aliases)) {
                auto check = endTemplate.isTemplateMatch(possibility);
                if (check) {
                    endTemplate.setAsUsed(*check);
                }
            }
        }
    }
}